

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

bool llvm::cl::ExpandResponseFiles
               (StringSaver *Saver,TokenizerCallback Tokenizer,SmallVectorImpl<const_char_*> *Argv,
               bool MarkEOLs,bool RelativeNames)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  StringRef FName;
  SmallVector<const_char_*,_0U> ExpandedArgv;
  SmallVectorImpl<const_char_*> local_50;
  StringSaver *local_40;
  TokenizerCallback local_38;
  
  bVar3 = true;
  uVar8 = 0;
  uVar7 = 0;
  local_40 = Saver;
  local_38 = Tokenizer;
  while( true ) {
    uVar1 = (Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
            super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size;
    if (uVar1 == uVar7) {
      return bVar3;
    }
    if (uVar1 <= uVar7) break;
    pcVar2 = *(char **)((long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                              super_SmallVectorTemplateCommon<const_char_*,_void>.
                              super_SmallVectorBase.BeginX + (ulong)uVar7 * 8);
    if ((pcVar2 == (char *)0x0) || (*pcVar2 != '@')) {
      uVar7 = uVar7 + 1;
    }
    else {
      if (0x14 < uVar8) {
        return false;
      }
      local_50.super_SmallVectorTemplateBase<const_char_*,_true>.
      super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX = &local_40;
      local_50.super_SmallVectorTemplateBase<const_char_*,_true>.
      super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size = 0;
      local_50.super_SmallVectorTemplateBase<const_char_*,_true>.
      super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Capacity = 0;
      sVar5 = strlen(pcVar2 + 1);
      FName.Length = sVar5;
      FName.Data = pcVar2 + 1;
      bVar4 = ExpandResponseFile(FName,local_40,local_38,&local_50,MarkEOLs,RelativeNames);
      if (bVar4) {
        lVar6 = (ulong)uVar7 * 8;
        SmallVectorImpl<const_char_*>::erase
                  (Argv,(const_iterator)
                        ((long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                               super_SmallVectorTemplateCommon<const_char_*,_void>.
                               super_SmallVectorBase.BeginX + lVar6));
        SmallVectorImpl<char_const*>::insert<char_const**,void>
                  ((SmallVectorImpl<char_const*> *)Argv,
                   (iterator)
                   (lVar6 + (long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                                  super_SmallVectorTemplateCommon<const_char_*,_void>.
                                  super_SmallVectorBase.BeginX),
                   (char **)local_50.super_SmallVectorTemplateBase<const_char_*,_true>.
                            super_SmallVectorTemplateCommon<const_char_*,_void>.
                            super_SmallVectorBase.BeginX,
                   (char **)((long)local_50.super_SmallVectorTemplateBase<const_char_*,_true>.
                                   super_SmallVectorTemplateCommon<const_char_*,_void>.
                                   super_SmallVectorBase.BeginX +
                            (local_50.super_SmallVectorTemplateBase<const_char_*,_true>.
                             super_SmallVectorTemplateCommon<const_char_*,_void>.
                             super_SmallVectorBase._8_8_ & 0xffffffff) * 8));
      }
      else {
        uVar7 = uVar7 + 1;
        bVar3 = false;
      }
      uVar8 = uVar8 + 1;
      SmallVectorImpl<const_char_*>::~SmallVectorImpl(&local_50);
    }
  }
  __assert_fail("idx < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x9b,
                "reference llvm::SmallVectorTemplateCommon<const char *>::operator[](size_type) [T = const char *]"
               );
}

Assistant:

bool cl::ExpandResponseFiles(StringSaver &Saver, TokenizerCallback Tokenizer,
                             SmallVectorImpl<const char *> &Argv,
                             bool MarkEOLs, bool RelativeNames) {
  unsigned RspFiles = 0;
  bool AllExpanded = true;

  // Don't cache Argv.size() because it can change.
  for (unsigned I = 0; I != Argv.size();) {
    const char *Arg = Argv[I];
    // Check if it is an EOL marker
    if (Arg == nullptr) {
      ++I;
      continue;
    }
    if (Arg[0] != '@') {
      ++I;
      continue;
    }

    // If we have too many response files, leave some unexpanded.  This avoids
    // crashing on self-referential response files.
    if (RspFiles++ > 20)
      return false;

    // Replace this response file argument with the tokenization of its
    // contents.  Nested response files are expanded in subsequent iterations.
    SmallVector<const char *, 0> ExpandedArgv;
    if (!ExpandResponseFile(Arg + 1, Saver, Tokenizer, ExpandedArgv,
                            MarkEOLs, RelativeNames)) {
      // We couldn't read this file, so we leave it in the argument stream and
      // move on.
      AllExpanded = false;
      ++I;
      continue;
    }
    Argv.erase(Argv.begin() + I);
    Argv.insert(Argv.begin() + I, ExpandedArgv.begin(), ExpandedArgv.end());
  }
  return AllExpanded;
}